

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int AnalyzeResponseDescriptorRPLIDAR
              (uchar *buf,int buflen,int *pDataResponseLength,int *pSendMode,int *pDataType,
              int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  int iVar1;
  int *pnbBytesToRequest_local;
  int *pDataType_local;
  int *pSendMode_local;
  int *pDataResponseLength_local;
  int buflen_local;
  uchar *buf_local;
  
  *pDataResponseLength = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 7) {
    *pnbBytesToRequest = 7 - buflen;
    buf_local._4_4_ = 6;
  }
  else if ((*buf == 0xa5) && (buf[1] == 'Z')) {
    iVar1 = GetDataResponseLengthFromResponseDescriptorRPLIDAR(buf,buflen);
    *pDataResponseLength = iVar1;
    iVar1 = GetSendModeFromResponseDescriptorRPLIDAR(buf,buflen);
    *pSendMode = iVar1;
    *pDataType = (uint)buf[6];
    buf_local._4_4_ = 0;
  }
  else {
    printf("Warning : RPLIDAR bad start flag. \n");
    *pnbBytesToDiscard = 1;
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeResponseDescriptorRPLIDAR(unsigned char* buf, int buflen, int* pDataResponseLength, int* pSendMode, int* pDataType, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*pDataResponseLength = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR)
	{
		*pnbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != START_FLAG1_RPLIDAR)||(buf[1] != START_FLAG2_RPLIDAR))
	{
		printf("Warning : RPLIDAR bad start flag. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first start flag byte can be discarded...
		return EXIT_FAILURE;
	}
	*pDataResponseLength = GetDataResponseLengthFromResponseDescriptorRPLIDAR(buf, buflen);	
	*pSendMode = GetSendModeFromResponseDescriptorRPLIDAR(buf, buflen);	
	*pDataType = buf[6];

	return EXIT_SUCCESS;
}